

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<chaiscript::dispatch::Dynamic_Object>
          (Dynamic_Object *t,bool t_return_value)

{
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *ptr;
  shared_ptr<chaiscript::dispatch::Dynamic_Object> p;
  Dynamic_Object *in_stack_ffffffffffffffa8;
  Dynamic_Object **in_stack_ffffffffffffffb0;
  shared_ptr<chaiscript::dispatch::Dynamic_Object> *in_stack_ffffffffffffffb8;
  Any *in_stack_ffffffffffffffc0;
  Type_Info *in_stack_ffffffffffffffc8;
  __shared_ptr<chaiscript::dispatch::Dynamic_Object,_(__gnu_cxx::_Lock_policy)2> local_28;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::make_shared<chaiscript::dispatch::Dynamic_Object,chaiscript::dispatch::Dynamic_Object>
            (in_stack_ffffffffffffffa8);
  std::__shared_ptr<chaiscript::dispatch::Dynamic_Object,_(__gnu_cxx::_Lock_policy)2>::get
            (&local_28);
  chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Dynamic_Object>::get();
  chaiscript::detail::Any::Any<std::shared_ptr<chaiscript::dispatch::Dynamic_Object>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::dispatch::Dynamic_Object*&,bool&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(bool *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(bool *)in_stack_ffffffffffffffa8);
  chaiscript::detail::Any::~Any((Any *)0x262928);
  std::shared_ptr<chaiscript::dispatch::Dynamic_Object>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Dynamic_Object> *)0x262932);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(T t, bool t_return_value)
          {
            auto p = std::make_shared<T>(std::move(t));
            auto ptr = p.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(p)),
                  false,
                  ptr,
                  t_return_value
                );
          }